

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_u_mul(double *res,double *u,double *v,size_t n,size_t m)

{
  size_t mn;
  size_t p0;
  size_t p;
  size_t k;
  size_t j;
  size_t i;
  size_t m_local;
  size_t n_local;
  double *v_local;
  double *u_local;
  double *res_local;
  
  for (k = 0; k < m; k = k + 1) {
    p = 0;
    mn = k;
    for (j = 0; j < n; j = j + 1) {
      res[mn] = u[p] * v[mn];
      p0 = mn;
      while (p = p + 1, p0 = p0 + m, p0 < m * n) {
        res[mn] = u[p] * v[p0] + res[mn];
      }
      mn = m + mn;
    }
  }
  return;
}

Assistant:

void fsnav_linal_u_mul(double* res, double* u, double* v, const size_t n, const size_t m)
{
	size_t i, j, k, p, p0, mn;

	mn = m*n;
	for (j = 0; j < m; j++) {
		for (i = 0, k = 0, p0 = j; i < n; i++, p0 += m) {
			res[p0] = u[k]*v[p0];
			for (p = p0+m, k++; p < mn; p += m, k++)
				res[p0] += u[k]*v[p];
		}
	}
}